

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86::forwardDilation_x86
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  _func_int *p_Var5;
  Layer *pLVar6;
  int iVar7;
  size_t sVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  undefined4 *puVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  int _w;
  void *pvVar19;
  long lVar20;
  int iVar21;
  int _w_00;
  ulong uVar22;
  ulong uVar23;
  int _w_01;
  long lVar24;
  int iVar25;
  undefined4 *puVar26;
  long lVar27;
  int local_1fc;
  long local_1e0;
  long local_1d8;
  Mat local_198;
  ulong local_158;
  size_t local_150;
  ulong local_148;
  ulong local_140;
  Mat *local_138;
  ulong local_130;
  ulong local_128;
  long local_120;
  ulong local_118;
  long local_110;
  Mat inner_top_blob;
  Mat inner_bottom_blob;
  Option opt_g;
  
  iVar1 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  local_150 = bottom_blob->elemsize;
  p_Var5 = this->_vptr_Convolution_x86[-3];
  iVar3 = *(int *)(&this->field_0xbc + (long)p_Var5);
  iVar4 = *(int *)(p_Var5 + 0xc + (long)&(this->weight_3x3_winograd23_data_int8).data);
  local_158 = (ulong)*(int *)(p_Var5 + 4 + (long)&(this->weight_3x3_winograd23_data_int8).data);
  iVar21 = (iVar3 + -1) * *(int *)(p_Var5 + 4 + (long)&(this->weight_3x3_winograd23_data_int8).data)
           + 1;
  iVar7 = (iVar1 - iVar21) / iVar4;
  _w = iVar7 + 1;
  Mat::create(top_blob,_w,(iVar2 - iVar21) / iVar4 + 1,
              *(int *)(&this->use_winograd3x3_int8 + (long)p_Var5),local_150,opt->blob_allocator);
  uVar9 = local_158;
  local_1fc = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    iVar21 = (int)local_158;
    uVar23 = local_158 & 0xffffffff;
    inner_bottom_blob.elemsize._0_4_ = 0;
    inner_bottom_blob.elemsize._4_4_ = 0;
    inner_bottom_blob.elempack = 0;
    inner_bottom_blob.data = (void *)0x0;
    inner_bottom_blob.refcount._0_4_ = 0;
    inner_bottom_blob.refcount._4_4_ = 0;
    inner_bottom_blob.allocator = (Allocator *)0x0;
    inner_bottom_blob.dims = 0;
    inner_bottom_blob.w = 0;
    inner_bottom_blob.h = 0;
    inner_bottom_blob.c = 0;
    inner_bottom_blob.cstep = 0;
    inner_top_blob.elemsize._0_4_ = 0;
    inner_top_blob.elemsize._4_4_ = 0;
    inner_top_blob.elempack = 0;
    inner_top_blob.data = (void *)0x0;
    inner_top_blob.refcount._0_4_ = 0;
    inner_top_blob.refcount._4_4_ = 0;
    inner_top_blob.allocator = (Allocator *)0x0;
    inner_top_blob.dims = 0;
    inner_top_blob.w = 0;
    inner_top_blob.h = 0;
    inner_top_blob.c = 0;
    inner_top_blob.cstep = 0;
    uVar22 = 0;
    if (0 < iVar21) {
      uVar22 = local_158 & 0xffffffff;
    }
    local_1fc = -100;
    local_1d8 = 0;
    local_1e0 = 0;
    local_138 = top_blob;
    local_130 = uVar22;
    local_128 = uVar23;
    for (uVar15 = 0; uVar15 != uVar22; uVar15 = uVar15 + 1) {
      local_120 = local_1d8;
      local_110 = local_1e0;
      uVar11 = 0;
      while (uVar11 != uVar23) {
        uVar22 = (long)((iVar21 + -1 + iVar1) - (int)uVar11) / (long)(int)local_158;
        uVar23 = (long)((iVar21 + iVar2 + -1) - (int)uVar15) / (long)(int)uVar23;
        uVar17 = uVar23 & 0xffffffff;
        _w_01 = (int)uVar22;
        local_140 = (long)(_w_01 - iVar3) / (long)iVar4 & 0xffffffff;
        iVar25 = (int)uVar23;
        local_148 = (long)(iVar25 - iVar3) / (long)iVar4 & 0xffffffff;
        local_118 = uVar11;
        Mat::create(&inner_bottom_blob,_w_01,iVar25,bottom_blob->c,local_150,
                    opt->workspace_allocator);
        if ((inner_bottom_blob.data == (void *)0x0) ||
           ((long)inner_bottom_blob.c * inner_bottom_blob.cstep == 0)) goto LAB_00124314;
        _w_00 = (int)local_140 + 1;
        Mat::create(&inner_top_blob,_w_00,(int)local_148 + 1,
                    *(int *)(&this->use_winograd3x3_int8 + (long)this->_vptr_Convolution_x86[-3]),
                    local_150,opt->workspace_allocator);
        if ((inner_top_blob.data == (void *)0x0) ||
           ((long)inner_top_blob.c * inner_top_blob.cstep == 0)) goto LAB_00124314;
        uVar22 = uVar22 & 0xffffffff;
        if (_w_01 < 1) {
          uVar22 = 0;
        }
        if (iVar25 < 1) {
          uVar17 = 0;
        }
        for (lVar16 = 0; sVar10 = inner_bottom_blob.cstep, pvVar19 = inner_bottom_blob.data,
            lVar16 < bottom_blob->c; lVar16 = lVar16 + 1) {
          sVar8 = CONCAT44(inner_bottom_blob.elemsize._4_4_,(undefined4)inner_bottom_blob.elemsize);
          local_198.data =
               (void *)(inner_bottom_blob.cstep * lVar16 * sVar8 + (long)inner_bottom_blob.data);
          local_198.refcount = (int *)0x0;
          local_198.elempack = inner_bottom_blob.elempack;
          local_198.allocator = inner_bottom_blob.allocator;
          local_198.dims = 2;
          local_198.w = inner_bottom_blob.w;
          local_198.h = inner_bottom_blob.h;
          local_198.c = 1;
          local_198.cstep = (size_t)(inner_bottom_blob.h * inner_bottom_blob.w);
          local_198.elemsize = sVar8;
          Mat::~Mat(&local_198);
          pvVar19 = (void *)(sVar10 * sVar8 * lVar16 + (long)pvVar19);
          iVar25 = 0;
          for (uVar23 = 0; uVar23 != uVar17; uVar23 = uVar23 + 1) {
            Mat::channel(&local_198,bottom_blob,(int)lVar16);
            puVar26 = (undefined4 *)((long)local_198.data + (long)iVar25 * 4 + local_110);
            Mat::~Mat(&local_198);
            for (uVar11 = 0; uVar22 != uVar11; uVar11 = uVar11 + 1) {
              *(undefined4 *)((long)pvVar19 + uVar11 * 4) = *puVar26;
              puVar26 = puVar26 + uVar9;
            }
            pvVar19 = (void *)((long)pvVar19 + (long)_w_01 * 4);
            iVar25 = iVar25 + iVar21 * iVar1;
          }
        }
        opt_g.lightmode = opt->lightmode;
        opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
        opt_g.num_threads = opt->num_threads;
        opt_g.workspace_allocator._0_4_ = *(undefined4 *)&opt->workspace_allocator;
        opt_g.workspace_allocator._4_4_ = *(undefined4 *)((long)&opt->workspace_allocator + 4);
        opt_g.use_winograd_convolution = opt->use_winograd_convolution;
        opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
        opt_g.use_int8_inference = opt->use_int8_inference;
        opt_g.use_vulkan_compute = opt->use_vulkan_compute;
        opt_g.use_fp16_packed = opt->use_fp16_packed;
        opt_g.use_fp16_storage = opt->use_fp16_storage;
        opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
        opt_g.use_int8_storage = opt->use_int8_storage;
        opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_g.use_packing_layout = opt->use_packing_layout;
        opt_g.use_shader_pack8 = opt->use_shader_pack8;
        opt_g.use_bf16_storage = opt->use_bf16_storage;
        opt_g._36_4_ = *(undefined4 *)&opt->field_0x24;
        opt_g.blob_allocator = inner_top_blob.allocator;
        (*this->convolution_dilation1->_vptr_Layer[7])
                  (this->convolution_dilation1,&inner_bottom_blob,&inner_top_blob,&opt_g);
        lVar27 = (long)(int)local_140;
        lVar16 = (long)(int)local_148;
        lVar18 = 0;
        while( true ) {
          if (*(int *)(&this->use_winograd3x3_int8 + (long)this->_vptr_Convolution_x86[-3]) <=
              lVar18) break;
          Mat::channel(&local_198,local_138,(int)lVar18);
          puVar26 = (undefined4 *)((long)local_198.data + local_120);
          Mat::~Mat(&local_198);
          lVar24 = 0;
          for (lVar13 = 0; pvVar19 = inner_top_blob.data, lVar13 <= lVar16; lVar13 = lVar13 + 1) {
            local_198.elemsize =
                 CONCAT44(inner_top_blob.elemsize._4_4_,(undefined4)inner_top_blob.elemsize);
            lVar20 = inner_top_blob.cstep * lVar18 * local_198.elemsize;
            local_198.data = (void *)((long)inner_top_blob.data + lVar20);
            local_198.refcount = (int *)0x0;
            local_198.elempack = inner_top_blob.elempack;
            local_198.allocator = inner_top_blob.allocator;
            local_198.dims = 2;
            local_198.w = inner_top_blob.w;
            local_198.h = inner_top_blob.h;
            local_198.c = 1;
            local_198.cstep = (size_t)(inner_top_blob.h * inner_top_blob.w);
            Mat::~Mat(&local_198);
            puVar12 = puVar26;
            for (lVar14 = 0; lVar14 <= lVar27; lVar14 = lVar14 + 1) {
              *puVar12 = *(undefined4 *)((long)pvVar19 + lVar14 * 4 + lVar20 + lVar24);
              puVar12 = puVar12 + uVar9;
            }
            lVar24 = lVar24 + (long)_w_00 * 4;
            puVar26 = puVar26 + _w * iVar21;
          }
          lVar18 = lVar18 + 1;
        }
        local_110 = local_110 + 4;
        local_120 = local_120 + 4;
        uVar23 = local_128;
        uVar22 = local_130;
        uVar11 = local_118 + 1;
      }
      local_1e0 = local_1e0 + (long)iVar1 * 4;
      local_1d8 = local_1d8 + (long)iVar7 * 4 + 4;
    }
    pLVar6 = this->activation;
    local_1fc = 0;
    if (pLVar6 != (Layer *)0x0) {
      (*pLVar6->_vptr_Layer[9])(pLVar6,local_138,opt);
    }
LAB_00124314:
    Mat::~Mat(&inner_top_blob);
    Mat::~Mat(&inner_bottom_blob);
  }
  return local_1fc;
}

Assistant:

int Convolution_x86::forwardDilation_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x ++)
    {
        for (int y = 0; y < dilation; y ++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c ++)
            {
                float *outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i ++)
                {
                    const float* ptr = (const float *)bottom_blob.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j ++)
                    {
                        outptr[j] = ptr[j*dilation];
                    }
                    outptr += inner_w;
                }
            }

            Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            convolution_dilation1->forward(inner_bottom_blob, inner_top_blob, opt_g);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c ++)
            {
                float *outptr = (float *)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i ++)
                {
                    const float* ptr = (const float *)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j ++)
                    {
                        outptr[j*dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}